

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

PAL_ERROR MAPDesiredAccessAllowed
                    (DWORD flProtect,DWORD dwUserDesiredAccess,DWORD dwDesiredAccessWhenOpened)

{
  DWORD dwDesiredAccessWhenOpened_local;
  DWORD dwUserDesiredAccess_local;
  DWORD flProtect_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if ((dwUserDesiredAccess == 4) || (flProtect != 2)) {
    if ((dwUserDesiredAccess == 2) && (flProtect != 4)) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      dwUserDesiredAccess_local = 0x57;
    }
    else if ((dwUserDesiredAccess == 1) && (flProtect != 8)) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      dwUserDesiredAccess_local = 0x57;
    }
    else if ((dwUserDesiredAccess == 4) &&
            ((dwDesiredAccessWhenOpened != 4 && (dwDesiredAccessWhenOpened != 6)))) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      dwUserDesiredAccess_local = 5;
    }
    else if (((dwUserDesiredAccess & 2) == 0) ||
            ((dwDesiredAccessWhenOpened == 2 || (dwDesiredAccessWhenOpened == 6)))) {
      if ((dwUserDesiredAccess == 1) && (dwDesiredAccessWhenOpened != 1)) {
        if (!PAL_InitializeChakraCoreCalled) {
          abort();
        }
        dwUserDesiredAccess_local = 5;
      }
      else {
        dwUserDesiredAccess_local = 0;
      }
    }
    else {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      dwUserDesiredAccess_local = 5;
    }
  }
  else {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    dwUserDesiredAccess_local = 0x57;
  }
  return dwUserDesiredAccess_local;
}

Assistant:

static PAL_ERROR MAPDesiredAccessAllowed( DWORD flProtect,
                                     DWORD dwUserDesiredAccess,
                                     DWORD dwDesiredAccessWhenOpened )
{
    TRACE( "flProtect=%d, dwUserDesiredAccess=%d, dwDesiredAccessWhenOpened=%d\n",
           flProtect, dwUserDesiredAccess, dwDesiredAccessWhenOpened );

    /* check flProtect parameters*/
    if ( FILE_MAP_READ!= dwUserDesiredAccess && PAGE_READONLY == flProtect )
    {
        ERROR( "map object is read-only, can't map a view with write access\n");
        return ERROR_INVALID_PARAMETER;
    }

    if ( FILE_MAP_WRITE == dwUserDesiredAccess && PAGE_READWRITE != flProtect )
    {
        ERROR( "map object not open read-write, can't map a view with write "
               "access.\n" );
        return ERROR_INVALID_PARAMETER;
    }

    if ( FILE_MAP_COPY == dwUserDesiredAccess  && PAGE_WRITECOPY != flProtect )
    {
        ERROR( "map object not open for copy-on-write, can't map copy-on-write "
               "view.\n" );
        return ERROR_INVALID_PARAMETER;
    }
    
    /* Check to see we don't confict with the desired access we
    opened the mapping object with. */
    if ( ( dwUserDesiredAccess == FILE_MAP_READ ) &&
        !( ( dwDesiredAccessWhenOpened == FILE_MAP_READ ) || 
           ( dwDesiredAccessWhenOpened == FILE_MAP_ALL_ACCESS ) ) ) 
    {
        ERROR( "dwDesiredAccess conflict : read access requested, object not "
               "opened with read access.\n" );
        return ERROR_ACCESS_DENIED;
    }
    if ( ( dwUserDesiredAccess & FILE_MAP_WRITE ) &&
        !( ( dwDesiredAccessWhenOpened == FILE_MAP_WRITE ) || 
           ( dwDesiredAccessWhenOpened == FILE_MAP_ALL_ACCESS ) ) ) 
    {
        ERROR( "dwDesiredAccess conflict : write access requested, object not "
               "opened with write access.\n" );
        return ERROR_ACCESS_DENIED;
    }
    if ( ( dwUserDesiredAccess == FILE_MAP_COPY ) &&
        !( dwDesiredAccessWhenOpened == FILE_MAP_COPY ) )
    {
        ERROR( "dwDesiredAccess conflict : copy-on-write access requested, "
               "object not opened with copy-on-write access.\n" );
        return ERROR_ACCESS_DENIED;
    }

    return NO_ERROR;
}